

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int js_parse_template(JSParseState *s,int call,int *argc)

{
  JSValue v;
  JSValue v_00;
  JSValue v_01;
  JSValue obj;
  JSValue obj_00;
  JSValue val;
  JSValue val_00;
  JSValue val_01;
  JSValue val_02;
  JSValue this_obj;
  int iVar1;
  JSParseState *s_00;
  int *in_RDX;
  int in_ESI;
  JSParseState *in_RDI;
  JSValue JVar2;
  JSString *str;
  uint8_t *p;
  int ret;
  int depth;
  JSToken cooked;
  JSValue template_object;
  JSValue raw_array;
  JSContext *ctx;
  undefined4 in_stack_fffffffffffffee8;
  undefined2 in_stack_fffffffffffffeec;
  uint16_t in_stack_fffffffffffffeee;
  JSContext *in_stack_fffffffffffffef0;
  JSContext *ctx_00;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined4 in_stack_ffffffffffffff00;
  uint in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  JSContext *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  JSValueUnion in_stack_ffffffffffffff20;
  JSValueUnion in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  JSAtom in_stack_ffffffffffffff34;
  JSContext *in_stack_ffffffffffffff38;
  JSValue in_stack_ffffffffffffff40;
  JSParseState *s_01;
  JSValue in_stack_ffffffffffffff50;
  BOOL do_throw;
  int in_stack_ffffffffffffff64;
  JSParseState *s_02;
  int iVar3;
  int local_7c;
  undefined1 local_78 [16];
  JSContext *local_68;
  undefined8 in_stack_ffffffffffffffa0;
  JSContext *pJVar4;
  
  ctx_00 = in_RDI->ctx;
  iVar3 = 0;
  do_throw = 0;
  s_02 = (JSParseState *)0x3;
  if (in_ESI != 0) {
    in_stack_ffffffffffffff50 = JS_NewArray(in_stack_fffffffffffffef0);
    iVar1 = JS_IsException(in_stack_ffffffffffffff50);
    if (iVar1 != 0) {
      return -1;
    }
    val_01.tag = (int64_t)in_stack_ffffffffffffff28.ptr;
    val_01.u.float64 = in_stack_ffffffffffffff20.float64;
    iVar1 = emit_push_const((JSParseState *)
                            CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),val_01,
                            (BOOL)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    JVar2.u._4_4_ = in_stack_fffffffffffffefc;
    JVar2.u.int32 = in_stack_fffffffffffffef8;
    JVar2.tag._0_4_ = in_stack_ffffffffffffff00;
    JVar2.tag._4_4_ = in_stack_ffffffffffffff04;
    JS_FreeValue(in_stack_fffffffffffffef0,JVar2);
    if (iVar1 != 0) {
      return -1;
    }
    in_stack_ffffffffffffff40 = JS_NewArray(in_stack_fffffffffffffef0);
    iVar1 = JS_IsException(in_stack_ffffffffffffff40);
    if (iVar1 != 0) {
      return -1;
    }
    in_stack_fffffffffffffee8 = 0x4000;
    iVar3 = JS_DefinePropertyValue
                      (in_stack_ffffffffffffff38,in_stack_ffffffffffffff50,in_stack_ffffffffffffff34
                       ,in_stack_ffffffffffffff40,iVar3);
    if (iVar3 < 0) {
      return -1;
    }
  }
  local_7c = 0;
  while( true ) {
    if ((in_RDI->token).val != -0x7e) {
      iVar3 = js_parse_expect((JSParseState *)
                              CONCAT26(in_stack_fffffffffffffeee,
                                       CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)
                                      ),0);
      return iVar3;
    }
    s_00 = (JSParseState *)((in_RDI->token).ptr + 1);
    memcpy(local_78,&in_RDI->token,0x30);
    if (in_ESI == 0) {
      v.u._4_4_ = in_stack_fffffffffffffefc;
      v.u.int32 = in_stack_fffffffffffffef8;
      v.tag._0_4_ = in_stack_ffffffffffffff00;
      v.tag._4_4_ = in_stack_ffffffffffffff04;
      JS_FreeValue(in_stack_fffffffffffffef0,v);
      in_stack_ffffffffffffff00 = 0;
      in_stack_ffffffffffffff08 = 0;
      (in_RDI->token).u.str.str.u.ptr = (void *)((ulong)in_stack_ffffffffffffff04 << 0x20);
      (in_RDI->token).u.str.str.tag = 3;
      iVar3 = js_parse_string(s_02,in_stack_ffffffffffffff64,do_throw,
                              (uint8_t *)in_stack_ffffffffffffff50.tag,
                              (JSToken *)in_stack_ffffffffffffff50.u.ptr,
                              (uint8_t **)in_stack_ffffffffffffff40.tag);
      if (iVar3 != 0) {
        return -1;
      }
      in_stack_ffffffffffffff10 = local_68;
      if (((*(ulong *)&(local_68->header).field_0x4 & 0x7fffffff) == 0) && (local_7c != 0)) {
        v_01.u._4_4_ = in_stack_fffffffffffffefc;
        v_01.u.int32 = in_stack_fffffffffffffef8;
        v_01.tag._0_4_ = in_stack_ffffffffffffff00;
        v_01.tag._4_4_ = in_stack_ffffffffffffff04;
        JS_FreeValue(in_stack_fffffffffffffef0,v_01);
      }
      else {
        val_02.tag = (int64_t)in_stack_ffffffffffffff28.ptr;
        val_02.u.ptr = in_stack_ffffffffffffff20.ptr;
        iVar3 = emit_push_const((JSParseState *)
                                CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),val_02
                                ,(BOOL)((ulong)local_68 >> 0x20));
        v_00.u._4_4_ = in_stack_fffffffffffffefc;
        v_00.u.int32 = in_stack_fffffffffffffef8;
        v_00.tag._0_4_ = in_stack_ffffffffffffff00;
        v_00.tag._4_4_ = in_stack_ffffffffffffff04;
        JS_FreeValue(in_stack_fffffffffffffef0,v_00);
        s_01 = (JSParseState *)in_stack_ffffffffffffff40.tag;
        if (iVar3 != 0) {
          return -1;
        }
        if (local_7c == 0) {
          if ((in_RDI->token).u.str.sep == 0x60) goto LAB_001984b3;
          emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                  (uint8_t)((uint)in_stack_fffffffffffffefc >> 0x18));
          emit_atom((JSParseState *)in_stack_fffffffffffffef0,
                    CONCAT22(in_stack_fffffffffffffeee,in_stack_fffffffffffffeec));
        }
        local_7c = local_7c + 1;
      }
    }
    else {
      in_stack_fffffffffffffefc = local_7c;
      pJVar4 = ctx_00;
      JVar2 = JS_DupValue(ctx_00,(in_RDI->token).u.str.str);
      in_stack_ffffffffffffff28 = JVar2.u;
      in_stack_ffffffffffffff30 = (undefined4)JVar2.tag;
      in_stack_ffffffffffffff34 = JVar2.tag._4_4_;
      val.u._4_4_ = in_stack_ffffffffffffff1c;
      val.u.int32 = in_stack_ffffffffffffff18;
      val.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
      iVar3 = JS_DefinePropertyValueUint32
                        (in_stack_ffffffffffffff10,JVar2,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),val,
                         (int)in_stack_ffffffffffffffa0);
      if (iVar3 < 0) {
        return -1;
      }
      iVar3 = js_parse_string(s_02,in_stack_ffffffffffffff64,do_throw,
                              (uint8_t *)in_stack_ffffffffffffff50.tag,
                              (JSToken *)in_stack_ffffffffffffff50.u.ptr,
                              (uint8_t **)in_stack_ffffffffffffff40.tag);
      if (iVar3 != 0) {
        in_stack_ffffffffffffff18 = 0;
        in_stack_ffffffffffffff20.float64 = 1.48219693752374e-323;
        local_68 = (JSContext *)((ulong)in_stack_ffffffffffffff1c << 0x20);
        in_stack_ffffffffffffffa0 = 3;
      }
      in_stack_fffffffffffffee8 = 0x4004;
      this_obj.tag._0_4_ = in_stack_ffffffffffffff30;
      this_obj.u.float64 = in_stack_ffffffffffffff28.float64;
      this_obj.tag._4_4_ = in_stack_ffffffffffffff34;
      val_00.u._4_4_ = in_stack_ffffffffffffff1c;
      val_00.u.int32 = in_stack_ffffffffffffff18;
      val_00.tag = (int64_t)in_stack_ffffffffffffff20.ptr;
      iVar3 = JS_DefinePropertyValueUint32
                        (in_stack_ffffffffffffff10,this_obj,
                         (uint32_t)((ulong)in_stack_ffffffffffffff08 >> 0x20),val_00,
                         (int)in_stack_ffffffffffffffa0);
      in_stack_fffffffffffffef0 = ctx_00;
      ctx_00 = pJVar4;
      if (iVar3 < 0) {
        return -1;
      }
    }
    s_01 = (JSParseState *)in_stack_ffffffffffffff40.tag;
    if ((in_RDI->token).u.str.sep == 0x60) break;
    iVar3 = next_token(s_01);
    if (iVar3 != 0) {
      return -1;
    }
    iVar3 = js_parse_expr((JSParseState *)0x198346);
    if (iVar3 != 0) {
      return -1;
    }
    local_7c = local_7c + 1;
    if ((in_RDI->token).val != 0x7d) {
      iVar3 = js_parse_error(in_RDI,"expected \'}\' after template expression");
      return iVar3;
    }
    free_token((JSParseState *)in_stack_fffffffffffffef0,
               (JSToken *)
               CONCAT26(in_stack_fffffffffffffeee,
                        CONCAT24(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)));
    in_RDI->got_lf = 0;
    in_RDI->last_line_num = (in_RDI->token).line_num;
    iVar3 = js_parse_template_part
                      (s_00,(uint8_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                      );
    if (iVar3 != 0) {
      return -1;
    }
  }
  if (in_ESI == 0) {
    emit_op((JSParseState *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
            (uint8_t)((uint)in_stack_fffffffffffffefc >> 0x18));
    emit_u16((JSParseState *)in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
  }
  else {
    obj.u._4_4_ = in_stack_fffffffffffffefc;
    obj.u.int32 = in_stack_fffffffffffffef8;
    obj.tag._0_4_ = in_stack_ffffffffffffff00;
    obj.tag._4_4_ = in_stack_ffffffffffffff04;
    seal_template_obj(in_stack_fffffffffffffef0,obj);
    obj_00.u._4_4_ = in_stack_fffffffffffffefc;
    obj_00.u.int32 = in_stack_fffffffffffffef8;
    obj_00.tag._0_4_ = in_stack_ffffffffffffff00;
    obj_00.tag._4_4_ = in_stack_ffffffffffffff04;
    seal_template_obj(in_stack_fffffffffffffef0,obj_00);
    *in_RDX = local_7c + 1;
  }
LAB_001984b3:
  iVar3 = next_token(s_01);
  return iVar3;
}

Assistant:

static __exception int js_parse_template(JSParseState *s, int call, int *argc)
{
    JSContext *ctx = s->ctx;
    JSValue raw_array, template_object;
    JSToken cooked;
    int depth, ret;

    raw_array = JS_UNDEFINED; /* avoid warning */
    template_object = JS_UNDEFINED; /* avoid warning */
    if (call) {
        /* Create a template object: an array of cooked strings */
        /* Create an array of raw strings and store it to the raw property */
        template_object = JS_NewArray(ctx);
        if (JS_IsException(template_object))
            return -1;
        //        pool_idx = s->cur_func->cpool_count;
        ret = emit_push_const(s, template_object, 0);
        JS_FreeValue(ctx, template_object);
        if (ret)
            return -1;
        raw_array = JS_NewArray(ctx);
        if (JS_IsException(raw_array))
            return -1;
        if (JS_DefinePropertyValue(ctx, template_object, JS_ATOM_raw,
                                   raw_array, JS_PROP_THROW) < 0) {
            return -1;
        }
    }

    depth = 0;
    while (s->token.val == TOK_TEMPLATE) {
        const uint8_t *p = s->token.ptr + 1;
        cooked = s->token;
        if (call) {
            if (JS_DefinePropertyValueUint32(ctx, raw_array, depth,
                                             JS_DupValue(ctx, s->token.u.str.str),
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
            /* re-parse the string with escape sequences but do not throw a
               syntax error if it contains invalid sequences
             */
            if (js_parse_string(s, '`', FALSE, p, &cooked, &p)) {
                cooked.u.str.str = JS_UNDEFINED;
            }
            if (JS_DefinePropertyValueUint32(ctx, template_object, depth,
                                             cooked.u.str.str,
                                             JS_PROP_ENUMERABLE | JS_PROP_THROW) < 0) {
                return -1;
            }
        } else {
            JSString *str;
            /* re-parse the string with escape sequences and throw a
               syntax error if it contains invalid sequences
             */
            JS_FreeValue(ctx, s->token.u.str.str);
            s->token.u.str.str = JS_UNDEFINED;
            if (js_parse_string(s, '`', TRUE, p, &cooked, &p))
                return -1;
            str = JS_VALUE_GET_STRING(cooked.u.str.str);
            if (str->len != 0 || depth == 0) {
                ret = emit_push_const(s, cooked.u.str.str, 1);
                JS_FreeValue(s->ctx, cooked.u.str.str);
                if (ret)
                    return -1;
                if (depth == 0) {
                    if (s->token.u.str.sep == '`')
                        goto done1;
                    emit_op(s, OP_get_field2);
                    emit_atom(s, JS_ATOM_concat);
                }
                depth++;
            } else {
                JS_FreeValue(s->ctx, cooked.u.str.str);
            }
        }
        if (s->token.u.str.sep == '`')
            goto done;
        if (next_token(s))
            return -1;
        if (js_parse_expr(s))
            return -1;
        depth++;
        if (s->token.val != '}') {
            return js_parse_error(s, "expected '}' after template expression");
        }
        /* XXX: should convert to string at this stage? */
        free_token(s, &s->token);
        /* Resume TOK_TEMPLATE parsing (s->token.line_num and
         * s->token.ptr are OK) */
        s->got_lf = FALSE;
        s->last_line_num = s->token.line_num;
        if (js_parse_template_part(s, s->buf_ptr))
            return -1;
    }
    return js_parse_expect(s, TOK_TEMPLATE);

 done:
    if (call) {
        /* Seal the objects */
        seal_template_obj(ctx, raw_array);
        seal_template_obj(ctx, template_object);
        *argc = depth + 1;
    } else {
        emit_op(s, OP_call_method);
        emit_u16(s, depth - 1);
    }
 done1:
    return next_token(s);
}